

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_map.h
# Opt level: O2

void __thiscall cppcms::impl::string_map::add(string_map *this,char *key,char *value)

{
  string_map *d;
  pointer peVar1;
  pointer peVar2;
  pointer peVar3;
  ulong uVar4;
  string_map *psVar5;
  long lVar6;
  allocator_type local_65;
  int new_first;
  entry new_entry;
  _Vector_base<cppcms::impl::string_map::entry,_std::allocator<cppcms::impl::string_map::entry>_>
  local_48;
  
  new_entry.key = key;
  new_entry.value = value;
  new_entry.hash = entry::calc_hash(key);
  new_entry.next_index = 0;
  d = this + 0x10;
  uVar4 = (*(long *)(this + 0x18) - *(long *)(this + 0x10)) / 0x18;
  if (uVar4 <= (ulong)(*(long *)(this + 8) * 2)) {
    new_first = -1;
    std::vector<cppcms::impl::string_map::entry,_std::allocator<cppcms::impl::string_map::entry>_>::
    vector((vector<cppcms::impl::string_map::entry,_std::allocator<cppcms::impl::string_map::entry>_>
            *)&local_48,uVar4 * 2,&local_65);
    psVar5 = this;
    while ((long)*(int *)psVar5 != -1) {
      lVar6 = (long)*(int *)psVar5 * 0x18;
      insert((vector<cppcms::impl::string_map::entry,_std::allocator<cppcms::impl::string_map::entry>_>
              *)&local_48,(entry *)(*(long *)d + lVar6),&new_first);
      psVar5 = (string_map *)(*(long *)d + lVar6 + 0x14);
    }
    *(int *)this = new_first;
    peVar1 = *(pointer *)(this + 0x20);
    *(pointer *)(this + 0x20) = local_48._M_impl.super__Vector_impl_data._M_end_of_storage;
    peVar2 = *(pointer *)(this + 0x10);
    peVar3 = *(pointer *)(this + 0x18);
    *(pointer *)(this + 0x10) = local_48._M_impl.super__Vector_impl_data._M_start;
    *(pointer *)(this + 0x18) = local_48._M_impl.super__Vector_impl_data._M_finish;
    local_48._M_impl.super__Vector_impl_data._M_start = peVar2;
    local_48._M_impl.super__Vector_impl_data._M_finish = peVar3;
    local_48._M_impl.super__Vector_impl_data._M_end_of_storage = peVar1;
    std::
    _Vector_base<cppcms::impl::string_map::entry,_std::allocator<cppcms::impl::string_map::entry>_>
    ::~_Vector_base(&local_48);
  }
  insert((vector<cppcms::impl::string_map::entry,_std::allocator<cppcms::impl::string_map::entry>_>
          *)d,&new_entry,(int *)this);
  *(long *)(this + 8) = *(long *)(this + 8) + 1;
  return;
}

Assistant:

void add(char const *key,char const *value) {
				entry new_entry(key,value);
				if(total_ * 2 >= data_.size()) {
					int new_first = -1;
					std::vector<entry> new_data(data_.size()*2);
					for(iterator p = begin(),e = end();p!=e;++p) {
						insert(new_data,*p,new_first);
					}
					first_ = new_first;
					data_.swap(new_data);
				}
				insert(data_,new_entry,first_);
				total_++;
			}